

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDataflow_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::writeOp<(moira::Core)0,(moira::Mode)5,4,4ull>(Moira *this,int n,u32 ea,u32 val)

{
  this->writeBuffer = (u16)(val >> 0x10);
  write<(moira::Core)0,(moira::AddrSpace)1,4,4ull>(this,ea,val);
  return;
}

Assistant:

void
Moira::writeOp(int n, u32 ea, u32 val)
{
    switch (M) {

        case Mode::DN: writeD<S>(n, val); break;
        case Mode::AN: writeA<S>(n, val); break;
        case Mode::IM: fatalError;

        default:

            writeBuffer = (S == Long) ? u16(val >> 16) : u16(val & 0xFFFF);

            // Write to effective address
            writeM<C, M, S, F>(ea, val);
    }
}